

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

int __thiscall QtMWidgets::PickerPrivate::init(PickerPrivate *this,EVP_PKEY_CTX *ctx)

{
  Picker *this_00;
  undefined8 uVar1;
  int iVar2;
  QStandardItemModel *this_01;
  Scroller *this_02;
  long *plVar3;
  QStyleOption opt;
  QStyleOption aQStack_58 [40];
  undefined1 local_30 [24];
  
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  this_00 = this->q;
  this_01 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_01,0,1,(QObject *)this_00);
  Picker::setModel(this_00,(QAbstractItemModel *)this_01);
  this_02 = (Scroller *)operator_new(0x18);
  Scroller::Scroller(this_02,(QObject *)this->q,(QObject *)this->q);
  this->scroller = this_02;
  QStyleOption::QStyleOption(aQStack_58,1,0);
  QStyleOption::initFrom((QWidget *)aQStack_58);
  plVar3 = (long *)QPalette::brush((ColorGroup)local_30,Dark);
  uVar1 = *(undefined8 *)(*plVar3 + 8);
  *(undefined8 *)((long)&(this->highlightColor).ct + 2) = *(undefined8 *)(*plVar3 + 0xe);
  *(undefined8 *)&this->highlightColor = uVar1;
  iVar2 = QStyleOption::~QStyleOption(aQStack_58);
  return iVar2;
}

Assistant:

void
PickerPrivate::init()
{
	q->setSizePolicy( QSizePolicy( QSizePolicy::Preferred,
		QSizePolicy::Fixed ) );

	q->setModel( new QStandardItemModel( 0, 1, q ) );

	scroller = new Scroller( q, q );

	QStyleOption opt;
	opt.initFrom( q );

	highlightColor = opt.palette.color( QPalette::Highlight );
}